

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::OurReader::recoverFromError(OurReader *this,TokenType skipUntilToken)

{
  size_type __new_size;
  Token skip;
  Token local_40;
  
  __new_size = std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::
               size(&this->errors_);
  do {
    readToken(this,&local_40);
    if (local_40.type_ == skipUntilToken) break;
  } while (local_40.type_ != tokenEndOfStream);
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::resize
            (&this->errors_,__new_size);
  return false;
}

Assistant:

bool OurReader::recoverFromError(TokenType skipUntilToken) {
  size_t errorCount = errors_.size();
  Token skip;
  for (;;) {
    if (!readToken(skip))
      errors_.resize(errorCount); // discard errors caused by recovery
    if (skip.type_ == skipUntilToken || skip.type_ == tokenEndOfStream)
      break;
  }
  errors_.resize(errorCount);
  return false;
}